

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdarith.c
# Opt level: O0

boolean decode_mcu_DC_first(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  int iVar1;
  int iVar2;
  jpeg_entropy_decoder *pjVar3;
  size_t sVar4;
  _func_void_j_decompress_ptr *p_Var5;
  JBLOCKROW paJVar6;
  d_derived_tbl *htbl;
  boolean bVar7;
  uint uVar8;
  int iVar9;
  uint local_b4;
  int local_ac;
  int look;
  int nb;
  jpeg_component_info *compptr;
  d_derived_tbl *tbl;
  savable_state state;
  bitread_working_state br_state;
  _func_void_j_decompress_ptr *p_Stack_50;
  int bits_left;
  bit_buf_type get_buffer;
  JBLOCKROW block;
  int local_38;
  int ci;
  int blkn;
  int r;
  int s;
  int Al;
  huff_entropy_ptr entropy;
  JBLOCKROW *MCU_data_local;
  j_decompress_ptr cinfo_local;
  
  pjVar3 = cinfo->entropy;
  iVar1 = cinfo->Al;
  if (((cinfo->restart_interval == 0) || (*(int *)&pjVar3[3].decode_mcu != 0)) ||
     (bVar7 = process_restart(cinfo), bVar7 != 0)) {
    if (*(int *)((long)&pjVar3[3].start_pass + 4) == 0) {
      state.last_dc_val._8_8_ = cinfo->src->next_input_byte;
      sVar4 = cinfo->src->bytes_in_buffer;
      p_Stack_50 = pjVar3[1].start_pass;
      br_state.cinfo._4_4_ = *(int *)&pjVar3[1].decode_mcu;
      p_Var5 = pjVar3[2].start_pass;
      state._0_8_ = pjVar3[2].decode_mcu;
      state.last_dc_val[1] = *(int *)&pjVar3[3].start_pass;
      for (local_38 = 0; local_38 < cinfo->blocks_in_MCU; local_38 = local_38 + 1) {
        paJVar6 = MCU_data[local_38];
        iVar2 = cinfo->MCU_membership[local_38];
        htbl = (d_derived_tbl *)(&pjVar3[4].start_pass)[cinfo->cur_comp_info[iVar2]->dc_tbl_no];
        if (br_state.cinfo._4_4_ < 8) {
          bVar7 = jpeg_fill_bit_buffer
                            ((bitread_working_state *)(state.last_dc_val + 2),
                             (bit_buf_type)p_Stack_50,br_state.cinfo._4_4_,0);
          if (bVar7 == 0) {
            return 0;
          }
          p_Stack_50 = (_func_void_j_decompress_ptr *)br_state.bytes_in_buffer;
          br_state.cinfo._4_4_ = (int)br_state.get_buffer;
          if (7 < (int)br_state.get_buffer) goto LAB_00399d08;
          local_ac = 1;
LAB_00399d76:
          blkn = jpeg_huff_decode((bitread_working_state *)(state.last_dc_val + 2),
                                  (bit_buf_type)p_Stack_50,br_state.cinfo._4_4_,htbl,local_ac);
          if (blkn < 0) {
            return 0;
          }
          p_Stack_50 = (_func_void_j_decompress_ptr *)br_state.bytes_in_buffer;
          br_state.cinfo._4_4_ = (int)br_state.get_buffer;
        }
        else {
LAB_00399d08:
          uVar8 = (uint)((long)p_Stack_50 >> ((char)br_state.cinfo._4_4_ - 8U & 0x3f)) & 0xff;
          if (htbl->look_nbits[(int)uVar8] == 0) {
            local_ac = 9;
            goto LAB_00399d76;
          }
          br_state.cinfo._4_4_ = br_state.cinfo._4_4_ - htbl->look_nbits[(int)uVar8];
          blkn = (int)htbl->look_sym[(int)uVar8];
        }
        if (blkn != 0) {
          if (br_state.cinfo._4_4_ < blkn) {
            bVar7 = jpeg_fill_bit_buffer
                              ((bitread_working_state *)(state.last_dc_val + 2),
                               (bit_buf_type)p_Stack_50,br_state.cinfo._4_4_,blkn);
            if (bVar7 == 0) {
              return 0;
            }
            p_Stack_50 = (_func_void_j_decompress_ptr *)br_state.bytes_in_buffer;
            br_state.cinfo._4_4_ = (int)br_state.get_buffer;
          }
          br_state.cinfo._4_4_ = br_state.cinfo._4_4_ - blkn;
          local_b4 = (uint)((long)p_Stack_50 >> ((byte)br_state.cinfo._4_4_ & 0x3f)) & bmask[blkn];
          if ((int)local_b4 <= bmask[blkn + -1]) {
            local_b4 = local_b4 - bmask[blkn];
          }
          blkn = local_b4;
        }
        iVar9 = state.last_dc_val[(long)iVar2 + -2] + blkn;
        state.last_dc_val[(long)iVar2 + -2] = iVar9;
        (*paJVar6)[0] = (JCOEF)(iVar9 << ((byte)iVar1 & 0x1f));
      }
      cinfo->src->next_input_byte = (JOCTET *)state.last_dc_val._8_8_;
      cinfo->src->bytes_in_buffer = sVar4;
      pjVar3[1].start_pass = p_Stack_50;
      *(int *)&pjVar3[1].decode_mcu = br_state.cinfo._4_4_;
      pjVar3[2].start_pass = p_Var5;
      pjVar3[2].decode_mcu = (_func_boolean_j_decompress_ptr_JBLOCKROW_ptr *)state._0_8_;
      *(int *)&pjVar3[3].start_pass = state.last_dc_val[1];
    }
    *(int *)&pjVar3[3].decode_mcu = *(int *)&pjVar3[3].decode_mcu + -1;
    cinfo_local._4_4_ = 1;
  }
  else {
    cinfo_local._4_4_ = 0;
  }
  return cinfo_local._4_4_;
}

Assistant:

METHODDEF(boolean)
decode_mcu_DC_first (j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr) cinfo->entropy;
  JBLOCKROW block;
  unsigned char *st;
  int blkn, ci, tbl, sign;
  int v, m;

  /* Process restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      process_restart(cinfo);
    entropy->restarts_to_go--;
  }

  if (entropy->ct == -1) return TRUE;	/* if error do nothing */

  /* Outer loop handles each block in the MCU */

  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    block = MCU_data[blkn];
    ci = cinfo->MCU_membership[blkn];
    tbl = cinfo->cur_comp_info[ci]->dc_tbl_no;

    /* Sections F.2.4.1 & F.1.4.4.1: Decoding of DC coefficients */

    /* Table F.4: Point to statistics bin S0 for DC coefficient coding */
    st = entropy->dc_stats[tbl] + entropy->dc_context[ci];

    /* Figure F.19: Decode_DC_DIFF */
    if (arith_decode(cinfo, st) == 0)
      entropy->dc_context[ci] = 0;
    else {
      /* Figure F.21: Decoding nonzero value v */
      /* Figure F.22: Decoding the sign of v */
      sign = arith_decode(cinfo, st + 1);
      st += 2; st += sign;
      /* Figure F.23: Decoding the magnitude category of v */
      if ((m = arith_decode(cinfo, st)) != 0) {
	st = entropy->dc_stats[tbl] + 20;	/* Table F.4: X1 = 20 */
	while (arith_decode(cinfo, st)) {
	  if ((m <<= 1) == 0x8000) {
	    WARNMS(cinfo, JWRN_ARITH_BAD_CODE);
	    entropy->ct = -1;			/* magnitude overflow */
	    return TRUE;
	  }
	  st += 1;
	}
      }
      /* Section F.1.4.4.1.2: Establish dc_context conditioning category */
      if (m < (int) ((1L << cinfo->arith_dc_L[tbl]) >> 1))
	entropy->dc_context[ci] = 0;		   /* zero diff category */
      else if (m > (int) ((1L << cinfo->arith_dc_U[tbl]) >> 1))
	entropy->dc_context[ci] = 12 + (sign * 4); /* large diff category */
      else
	entropy->dc_context[ci] = 4 + (sign * 4);  /* small diff category */
      v = m;
      /* Figure F.24: Decoding the magnitude bit pattern of v */
      st += 14;
      while (m >>= 1)
	if (arith_decode(cinfo, st)) v |= m;
      v += 1; if (sign) v = -v;
      entropy->last_dc_val[ci] += v;
    }

    /* Scale and output the DC coefficient (assumes jpeg_natural_order[0]=0) */
    (*block)[0] = (JCOEF) (entropy->last_dc_val[ci] << cinfo->Al);
  }

  return TRUE;
}